

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::printSolutionStatistics(SoPlexBase<double> *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *in_RSI;
  SoPlexBase<double> *in_RDI;
  double dVar4;
  Rational *in_stack_000000f8;
  Rational *in_stack_00000100;
  SoPlexBase<double> *in_stack_00000108;
  double sumviol_1;
  double maxviol_1;
  Rational sumviol;
  Rational maxviol;
  fmtflags in_stack_fffffffffffffccc;
  ostream *in_stack_fffffffffffffcd0;
  SoPlexBase<double> *in_stack_fffffffffffffcd8;
  double *in_stack_fffffffffffffce0;
  SoPlexBase<double> *in_stack_fffffffffffffce8;
  double *in_stack_fffffffffffffcf8;
  double *in_stack_fffffffffffffd00;
  SoPlexBase<double> *in_stack_fffffffffffffd08;
  double *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  SoPlexBase<double> *in_stack_fffffffffffffd48;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  double local_208;
  double local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [16];
  Rational *in_stack_fffffffffffffe78;
  Rational *in_stack_fffffffffffffe80;
  SoPlexBase<double> *in_stack_fffffffffffffe88;
  string local_158 [32];
  string local_138 [32];
  string local_118 [16];
  Rational *in_stack_fffffffffffffef8;
  Rational *in_stack_ffffffffffffff00;
  SoPlexBase<double> *in_stack_ffffffffffffff08;
  undefined1 local_b8 [152];
  ostream *local_20;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_20 = in_RSI;
  SPxOut::setScientific(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  if (in_RDI->_lastSolveMode == 0) {
    poVar3 = std::operator<<(local_20,"Solution (real)     : \n");
    poVar3 = std::operator<<(poVar3,"  Objective value   : ");
    dVar4 = objValueReal(in_stack_fffffffffffffcd8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
    std::operator<<(poVar3,"\n");
  }
  else if (in_RDI->_lastSolveMode == 2) {
    poVar3 = std::operator<<(local_20,"Solution (rational) : \n");
    std::operator<<(poVar3,"  Objective value   : ");
    objValueRational(in_stack_fffffffffffffcd8);
    poVar3 = boost::multiprecision::operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::operator<<(poVar3,"\n");
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x44e032);
    poVar3 = std::operator<<(local_20,"Size (base 2/10)    : \n");
    poVar3 = std::operator<<(poVar3,"  Total primal      : ");
    iVar2 = totalSizePrimalRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = totalSizePrimalRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  Total dual        : ");
    iVar2 = totalSizeDualRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = totalSizeDualRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DLCM primal       : ");
    iVar2 = dlcmSizePrimalRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dlcmSizePrimalRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DLCM dual         : ");
    iVar2 = dlcmSizeDualRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dlcmSizeDualRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DMAX primal       : ");
    iVar2 = dmaxSizePrimalRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dmaxSizePrimalRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"  DMAX dual         : ");
    iVar2 = dmaxSizeDualRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," / ");
    iVar2 = dmaxSizeDualRational
                      (in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n");
  }
  else {
    poVar3 = std::operator<<(local_20,"Solution            : \n");
    std::operator<<(poVar3,"  Objective value   : -\n");
  }
  iVar2 = intParam(in_RDI,CHECKMODE);
  if ((iVar2 == 2) ||
     ((iVar2 = intParam(in_RDI,CHECKMODE), iVar2 == 1 &&
      (iVar2 = intParam(in_RDI,READMODE), iVar2 == 1)))) {
    local_10 = local_b8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x44e3f7);
    local_8 = &stack0xffffffffffffff08;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x44e414);
    std::operator<<(local_20,"Violation (rational): \n");
    bVar1 = getBoundViolationRational
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum bound     : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_118);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_138);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_118);
    }
    else {
      std::operator<<(local_20,"  Max/sum bound     : - / -\n");
    }
    bVar1 = getRowViolationRational
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum row       : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_158);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,(string *)&stack0xfffffffffffffe88);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
      std::__cxx11::string::~string(local_158);
    }
    else {
      std::operator<<(local_20,"  Max/sum row       : - / -\n");
    }
    bVar1 = getRedCostViolationRational
                      (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                      );
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum redcost   : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_198);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_1b8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_198);
    }
    else {
      std::operator<<(local_20,"  Max/sum redcost   : - / -\n");
    }
    bVar1 = getDualViolationRational(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum dual      : ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)in_stack_fffffffffffffcd8,(streamsize)in_stack_fffffffffffffcd0,
                       in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_1d8);
      poVar3 = std::operator<<(poVar3," / ");
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)poVar3,(streamsize)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      poVar3 = std::operator<<(poVar3,local_1f8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_1d8);
    }
    else {
      std::operator<<(local_20,"  Max/sum dual      : - / -\n");
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x44e9f7);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x44ea04);
  }
  else {
    std::operator<<(local_20,"Violations (real)   : \n");
    bVar1 = getBoundViolation(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                              in_stack_fffffffffffffcf8);
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum bound     : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_200);
      poVar3 = std::operator<<(poVar3," / ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_208);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_20,"  Max/sum bound     : - / -\n");
    }
    bVar1 = getRowViolation(in_stack_fffffffffffffd48,
                            (double *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38);
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum row       : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_200);
      poVar3 = std::operator<<(poVar3," / ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_208);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_20,"  Max/sum row       : - / -\n");
    }
    bVar1 = getRedCostViolation(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                                (double *)in_stack_fffffffffffffcd8);
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum redcost   : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_200);
      poVar3 = std::operator<<(poVar3," / ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_208);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_20,"  Max/sum redcost   : - / -\n");
    }
    bVar1 = getDualViolation(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                             (double *)in_stack_fffffffffffffcd8);
    if (bVar1) {
      poVar3 = std::operator<<(local_20,"  Max/sum dual      : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_200);
      poVar3 = std::operator<<(poVar3," / ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_208);
      std::operator<<(poVar3,"\n");
    }
    else {
      std::operator<<(local_20,"  Max/sum dual      : - / -\n");
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::printSolutionStatistics(std::ostream& os)
{
   SPxOut::setScientific(os);

   if(_lastSolveMode == SOLVEMODE_REAL)
   {
      os << "Solution (real)     : \n"
         << "  Objective value   : " << objValueReal() << "\n";
   }
   else if(_lastSolveMode == SOLVEMODE_RATIONAL)
   {
      os << "Solution (rational) : \n"
         << "  Objective value   : " << objValueRational() << "\n";
      os << "Size (base 2/10)    : \n"
         << "  Total primal      : " << totalSizePrimalRational() << " / " << totalSizePrimalRational(
            10) << "\n"
         << "  Total dual        : " << totalSizeDualRational() << " / " << totalSizeDualRational(10) << "\n"
         << "  DLCM primal       : " << dlcmSizePrimalRational() << " / " << dlcmSizePrimalRational(
            10) << "\n"
         << "  DLCM dual         : " << dlcmSizeDualRational() << " / " << dlcmSizeDualRational(10) << "\n"
         << "  DMAX primal       : " << dmaxSizePrimalRational() << " / " << dmaxSizePrimalRational(
            10) << "\n"
         << "  DMAX dual         : " << dmaxSizeDualRational() << " / " << dmaxSizeDualRational(10) << "\n";
   }
   else
   {
      os << "Solution            : \n"
         << "  Objective value   : -\n";
   }

   if(intParam(CHECKMODE) == CHECKMODE_RATIONAL
         || (intParam(CHECKMODE) == CHECKMODE_AUTO && intParam(READMODE) == READMODE_RATIONAL))
   {
      Rational maxviol;
      Rational sumviol;

      os << "Violation (rational): \n";

      if(getBoundViolationRational(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolationRational(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolationRational(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolationRational(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
   else
   {
      R maxviol;
      R sumviol;

      os << "Violations (real)   : \n";

      if(getBoundViolation(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolation(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolation(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolation(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
}